

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkCheckTemporalError(ARKodeMem ark_mem,int *nflagPtr,int *nefPtr,sunrealtype dsm)

{
  ARKodeHAdaptMem pAVar1;
  int *in_RDX;
  undefined4 *in_RSI;
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  ARKodeHAdaptMem unaff_retaddr;
  ARKodeMem_conflict in_stack_00000008;
  ARKodeHAdaptMem hadapt_mem;
  sunrealtype ttmp;
  int retval;
  double local_80;
  sunrealtype local_78;
  sunrealtype local_70;
  sunrealtype local_68;
  double local_60;
  sunrealtype local_58;
  sunrealtype local_50;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI->hadapt_mem == (ARKodeHAdaptMem)0x0) {
    arkProcessError(in_RDI,-0x15,0xc33,"arkCheckTemporalError",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"Adaptivity memory structure not allocated.");
    iVar2 = -0x15;
  }
  else {
    pAVar1 = in_RDI->hadapt_mem;
    iVar2 = arkAdapt(in_stack_00000008,unaff_retaddr,
                     (N_Vector)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (sunrealtype)in_RDI,(sunrealtype)in_RSI,(sunrealtype)in_RDX);
    if (iVar2 == 0) {
      if (in_RDI->hadapt_mem->etamax <= in_RDI->eta) {
        local_50 = in_RDI->hadapt_mem->etamax;
      }
      else {
        local_50 = in_RDI->eta;
      }
      in_RDI->eta = local_50;
      if (in_RDI->eta <= in_RDI->hmin / ABS(in_RDI->h)) {
        local_58 = in_RDI->hmin / ABS(in_RDI->h);
      }
      else {
        local_58 = in_RDI->eta;
      }
      in_RDI->eta = local_58;
      if (1.0 <= ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta) {
        local_60 = ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta;
      }
      else {
        local_60 = 1.0;
      }
      in_RDI->eta = in_RDI->eta / local_60;
      if (1.0 < in_XMM0_Qa) {
        *in_RDX = *in_RDX + 1;
        in_RDI->netf = in_RDI->netf + 1;
        *in_RSI = 8;
        if (*in_RDX == in_RDI->maxnef) {
          iVar2 = -3;
        }
        else {
          pAVar1->etamax = 1.0;
          if (pAVar1->small_nef <= *in_RDX) {
            if (pAVar1->etamxf <= in_RDI->eta) {
              local_68 = pAVar1->etamxf;
            }
            else {
              local_68 = in_RDI->eta;
            }
            in_RDI->eta = local_68;
          }
          if (in_RDI->hadapt_mem->etamax <= in_RDI->eta) {
            local_70 = in_RDI->hadapt_mem->etamax;
          }
          else {
            local_70 = in_RDI->eta;
          }
          in_RDI->eta = local_70;
          if (in_RDI->eta <= in_RDI->hmin / ABS(in_RDI->h)) {
            local_78 = in_RDI->hmin / ABS(in_RDI->h);
          }
          else {
            local_78 = in_RDI->eta;
          }
          in_RDI->eta = local_78;
          if (1.0 <= ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta) {
            local_80 = ABS(in_RDI->h) * in_RDI->hmax_inv * in_RDI->eta;
          }
          else {
            local_80 = 1.0;
          }
          in_RDI->eta = in_RDI->eta / local_80;
          iVar2 = 5;
        }
      }
      else {
        iVar2 = 0;
      }
    }
    else {
      iVar2 = -3;
    }
  }
  return iVar2;
}

Assistant:

int arkCheckTemporalError(ARKodeMem ark_mem, int* nflagPtr, int* nefPtr,
                          sunrealtype dsm)
{
  int retval;
  sunrealtype ttmp;
  ARKodeHAdaptMem hadapt_mem;

  /* Access hadapt_mem structure */
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKADAPT_NO_MEM);
    return (ARK_MEM_NULL);
  }
  hadapt_mem = ark_mem->hadapt_mem;

  /* consider change of step size for next step attempt (may be
     larger/smaller than current step, depending on dsm) */
  ttmp   = (dsm <= ONE) ? ark_mem->tn + ark_mem->h : ark_mem->tn;
  retval = arkAdapt(ark_mem, hadapt_mem, ark_mem->ycur, ttmp, ark_mem->h, dsm);
  if (retval != ARK_SUCCESS) { return (ARK_ERR_FAILURE); }

  /* if we've made it here then no nonrecoverable failures occurred; someone above
     has recommended an 'eta' value for the next step -- enforce bounds on that value
     and set upcoming step size */
  ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
  ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
  ark_mem->eta /=
    SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv * ark_mem->eta);

  /* If est. local error norm dsm passes test, return ARK_SUCCESS */
  if (dsm <= ONE) { return (ARK_SUCCESS); }

  /* Test failed; increment counters, set nflag */
  (*nefPtr)++;
  ark_mem->netf++;
  *nflagPtr = PREV_ERR_FAIL;

  /* At maxnef failures, return ARK_ERR_FAILURE */
  if (*nefPtr == ark_mem->maxnef) { return (ARK_ERR_FAILURE); }

  /* Set etamax=1 to prevent step size increase at end of this step */
  hadapt_mem->etamax = ONE;

  /* Enforce failure bounds on eta */
  if (*nefPtr >= hadapt_mem->small_nef)
  {
    ark_mem->eta = SUNMIN(ark_mem->eta, hadapt_mem->etamxf);
  }

  /* Enforce min/max step bounds once again due to adjustments above */
  ark_mem->eta = SUNMIN(ark_mem->eta, ark_mem->hadapt_mem->etamax);
  ark_mem->eta = SUNMAX(ark_mem->eta, ark_mem->hmin / SUNRabs(ark_mem->h));
  ark_mem->eta /=
    SUNMAX(ONE, SUNRabs(ark_mem->h) * ark_mem->hmax_inv * ark_mem->eta);

  return (TRY_AGAIN);
}